

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

int run_test_spawn_stdout_and_stderr_to_file_swap(void)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  undefined1 *puVar6;
  undefined1 *puVar7;
  char *pcVar8;
  uv_timer_t *puVar9;
  int extraout_EDX;
  char *pcVar10;
  ulong unaff_RBP;
  uv_process_t *puVar11;
  uv_timer_t *puVar12;
  code *pcVar13;
  uv_process_options_t *unaff_R14;
  undefined8 unaff_R15;
  uv_fs_t fs_req;
  uv_stdio_container_t stdio [3];
  int iStack_824;
  undefined1 auStack_820 [16];
  uv_stdio_container_t uStack_810;
  undefined4 uStack_800;
  undefined4 uStack_7f8;
  undefined4 uStack_7f0;
  undefined4 uStack_7e8;
  undefined4 uStack_7e0;
  int iStack_7d8;
  code *pcStack_7d0;
  undefined1 auStack_7c8 [240];
  code *pcStack_6d8;
  uv_stdio_container_t uStack_6d0;
  undefined4 uStack_6c0;
  undefined4 uStack_6b0;
  undefined4 uStack_6a0;
  undefined1 *puStack_698;
  undefined1 auStack_688 [264];
  undefined1 *puStack_580;
  anon_union_8_2_26168aa3_for_data aStack_578;
  code *pcStack_570;
  code *pcStack_568;
  char acStack_560 [32];
  undefined1 *puStack_540;
  undefined8 uStack_538;
  uv_stdio_container_t uStack_530;
  undefined4 uStack_520;
  undefined1 *puStack_518;
  undefined1 auStack_510 [264];
  undefined1 auStack_408 [264];
  undefined1 auStack_300 [192];
  char *pcStack_240;
  uv_process_options_t *puStack_238;
  code *pcStack_230;
  undefined8 local_228;
  undefined1 local_220 [16];
  uv_process_options_t local_210 [6];
  uv_stdio_container_t local_58;
  undefined4 local_48;
  uint local_40;
  undefined4 local_38;
  uint local_30;
  
  pcVar10 = "stdout_file";
  pcStack_230 = (code *)0x16cd4e;
  unlink("stdout_file");
  pcStack_230 = (code *)0x16cd5a;
  unlink("stderr_file");
  pcStack_230 = (code *)0x16cd6d;
  init_process_options("spawn_helper6",exit_cb);
  pcStack_230 = (code *)0x16cd8a;
  uVar1 = uv_fs_open(0,local_210,"stdout_file",0x42,0x180,0);
  if (uVar1 == 0xffffffff) {
    pcStack_230 = (code *)0x16d036;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_15();
LAB_0016d036:
    pcStack_230 = (code *)0x16d03b;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_14();
LAB_0016d03b:
    pcStack_230 = (code *)0x16d040;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_13();
LAB_0016d040:
    pcStack_230 = (code *)0x16d045;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_12();
LAB_0016d045:
    pcStack_230 = (code *)0x16d04a;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_1();
LAB_0016d04a:
    pcStack_230 = (code *)0x16d04f;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_2();
LAB_0016d04f:
    pcStack_230 = (code *)0x16d054;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_3();
LAB_0016d054:
    pcStack_230 = (code *)0x16d059;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_4();
LAB_0016d059:
    pcStack_230 = (code *)0x16d05e;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_5();
LAB_0016d05e:
    pcStack_230 = (code *)0x16d063;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_6();
LAB_0016d063:
    pcStack_230 = (code *)0x16d068;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_7();
LAB_0016d068:
    pcStack_230 = (code *)0x16d06d;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_8();
LAB_0016d06d:
    pcStack_230 = (code *)0x16d072;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_9();
LAB_0016d072:
    pcStack_230 = (code *)0x16d077;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_10();
  }
  else {
    pcVar10 = (char *)(ulong)uVar1;
    pcStack_230 = (code *)0x16cd9f;
    uv_fs_req_cleanup(local_210);
    pcStack_230 = (code *)0x16cdab;
    uVar1 = dup2(uVar1,1);
    if (uVar1 == 0xffffffff) goto LAB_0016d036;
    unaff_RBP = (ulong)uVar1;
    pcStack_230 = (code *)0x16cdd7;
    uVar2 = uv_fs_open(0,local_210,"stderr_file",0x42,0x180,0);
    if (uVar2 == 0xffffffff) goto LAB_0016d03b;
    pcVar10 = (char *)(ulong)uVar2;
    pcStack_230 = (code *)0x16cdec;
    uv_fs_req_cleanup(local_210);
    unaff_R15 = 2;
    pcStack_230 = (code *)0x16cdfe;
    uVar2 = dup2(uVar2,2);
    if (uVar2 == 0xffffffff) goto LAB_0016d040;
    pcVar10 = (char *)(ulong)uVar2;
    options.stdio = &local_58;
    unaff_R14 = &options;
    local_58.flags = UV_IGNORE;
    local_48 = 2;
    local_38 = 2;
    options.stdio_count = 3;
    pcStack_230 = (code *)0x16ce42;
    local_40 = uVar2;
    local_30 = uVar1;
    uVar5 = uv_default_loop();
    pcStack_230 = (code *)0x16ce54;
    iVar3 = uv_spawn(uVar5,&process,&options);
    if (iVar3 != 0) goto LAB_0016d045;
    pcStack_230 = (code *)0x16ce61;
    uVar5 = uv_default_loop();
    pcStack_230 = (code *)0x16ce6b;
    iVar3 = uv_run(uVar5,0);
    if (iVar3 != 0) goto LAB_0016d04a;
    if (exit_cb_called != 1) goto LAB_0016d04f;
    if (close_cb_called != 1) goto LAB_0016d054;
    pcStack_230 = (code *)0x16ce9e;
    local_220 = uv_buf_init(output,0x400);
    local_228 = 0;
    pcStack_230 = (code *)0x16cec9;
    iVar3 = uv_fs_read(0,local_210,uVar1,local_220,1,0);
    if (iVar3 < 0xf) goto LAB_0016d059;
    unaff_R14 = local_210;
    pcStack_230 = (code *)0x16cedf;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_230 = (code *)0x16ceed;
    iVar3 = uv_fs_close(0,unaff_R14,unaff_RBP,0);
    if (iVar3 != 0) goto LAB_0016d05e;
    pcStack_230 = (code *)0x16ceff;
    uv_fs_req_cleanup(local_210);
    pcStack_230 = (code *)0x16cf14;
    printf("output is: %s",output);
    if (CONCAT35(output._12_3_,CONCAT41(output._8_4_,output[7])) != 0xa646c726f777272 ||
        CONCAT17(output[7],output._0_7_) != 0x7265206f6c6c6568) goto LAB_0016d063;
    local_228 = 0;
    pcStack_230 = (code *)0x16cf63;
    iVar3 = uv_fs_read(0,local_210,uVar2,local_220,1,0);
    if (iVar3 < 0xc) goto LAB_0016d068;
    unaff_R14 = local_210;
    pcStack_230 = (code *)0x16cf79;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_230 = (code *)0x16cf87;
    iVar3 = uv_fs_close(0,unaff_R14,pcVar10,0);
    if (iVar3 != 0) goto LAB_0016d06d;
    pcStack_230 = (code *)0x16cf99;
    uv_fs_req_cleanup(local_210);
    pcStack_230 = (code *)0x16cfae;
    printf("output is: %s",output);
    if (output._8_4_ != 0xa646c72 || CONCAT17(output[7],output._0_7_) != 0x6f77206f6c6c6568)
    goto LAB_0016d072;
    pcStack_230 = (code *)0x16cfe1;
    unlink("stdout_file");
    pcStack_230 = (code *)0x16cfed;
    unlink("stderr_file");
    pcStack_230 = (code *)0x16cff2;
    pcVar10 = (char *)uv_default_loop();
    pcStack_230 = (code *)0x16d006;
    uv_walk(pcVar10,close_walk_cb,0);
    pcStack_230 = (code *)0x16d010;
    uv_run(pcVar10,0);
    pcStack_230 = (code *)0x16d015;
    uVar5 = uv_default_loop();
    pcStack_230 = (code *)0x16d01d;
    iVar3 = uv_loop_close(uVar5);
    if (iVar3 == 0) {
      return 0;
    }
  }
  pcStack_230 = run_test_spawn_stdin;
  run_test_spawn_stdout_and_stderr_to_file_swap_cold_11();
  pcVar8 = acStack_560;
  builtin_strncpy(acStack_560,"hello-from-spawn_stdin",0x17);
  pcStack_568 = (code *)0x16d0b5;
  pcStack_240 = pcVar10;
  puStack_238 = unaff_R14;
  pcStack_230 = (code *)unaff_R15;
  init_process_options("spawn_helper3",exit_cb);
  pcStack_568 = (code *)0x16d0ba;
  uVar5 = uv_default_loop();
  puVar7 = auStack_408;
  pcStack_568 = (code *)0x16d0cf;
  uv_pipe_init(uVar5,puVar7,0);
  pcStack_568 = (code *)0x16d0d4;
  uVar5 = uv_default_loop();
  pcStack_568 = (code *)0x16d0e6;
  uv_pipe_init(uVar5,(uv_stream_t *)auStack_510,0);
  options.stdio = &uStack_530;
  uStack_530.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  uStack_520 = 0x21;
  options.stdio_count = 2;
  pcStack_568 = (code *)0x16d11d;
  uStack_530.data.stream = (uv_stream_t *)auStack_510;
  puStack_518 = puVar7;
  puVar6 = (undefined1 *)uv_default_loop();
  iVar3 = 0x31aa10;
  pcStack_568 = (code *)0x16d12f;
  iVar4 = uv_spawn(puVar6,&process,&options);
  if (iVar4 == 0) {
    uStack_538 = 0x17;
    puVar6 = auStack_300;
    iVar3 = (int)auStack_510;
    pcStack_568 = (code *)0x16d168;
    puStack_540 = acStack_560;
    iVar4 = uv_write();
    if (iVar4 != 0) goto LAB_0016d213;
    iVar3 = 0x16c6a5;
    puVar6 = auStack_408;
    pcStack_568 = (code *)0x16d18b;
    iVar4 = uv_read_start(puVar6,on_alloc,on_read);
    if (iVar4 != 0) goto LAB_0016d218;
    pcStack_568 = (code *)0x16d198;
    puVar6 = (undefined1 *)uv_default_loop();
    iVar3 = 0;
    pcStack_568 = (code *)0x16d1a2;
    iVar4 = uv_run();
    if (iVar4 != 0) goto LAB_0016d21d;
    if (exit_cb_called != 1) goto LAB_0016d222;
    if (close_cb_called != 3) goto LAB_0016d227;
    iVar3 = 0x31aaa0;
    pcStack_568 = (code *)0x16d1c7;
    iVar4 = strcmp(acStack_560,output);
    if (iVar4 != 0) goto LAB_0016d22c;
    pcStack_568 = (code *)0x16d1d0;
    puVar7 = (undefined1 *)uv_default_loop();
    pcStack_568 = (code *)0x16d1e4;
    uv_walk(puVar7,close_walk_cb,0);
    iVar3 = 0;
    pcStack_568 = (code *)0x16d1ee;
    uv_run(puVar7);
    pcStack_568 = (code *)0x16d1f3;
    pcVar8 = (char *)uv_default_loop();
    pcStack_568 = (code *)0x16d1fb;
    iVar4 = uv_loop_close();
    if (iVar4 == 0) {
      return 0;
    }
  }
  else {
    pcStack_568 = (code *)0x16d213;
    run_test_spawn_stdin_cold_1();
LAB_0016d213:
    pcStack_568 = (code *)0x16d218;
    run_test_spawn_stdin_cold_2();
LAB_0016d218:
    pcStack_568 = (code *)0x16d21d;
    run_test_spawn_stdin_cold_3();
LAB_0016d21d:
    pcStack_568 = (code *)0x16d222;
    run_test_spawn_stdin_cold_4();
LAB_0016d222:
    pcStack_568 = (code *)0x16d227;
    run_test_spawn_stdin_cold_5();
LAB_0016d227:
    pcVar8 = puVar6;
    pcStack_568 = (code *)0x16d22c;
    run_test_spawn_stdin_cold_6();
LAB_0016d22c:
    pcStack_568 = (code *)0x16d231;
    run_test_spawn_stdin_cold_7();
  }
  pcStack_568 = write_cb;
  run_test_spawn_stdin_cold_8();
  if (iVar3 == 0) {
    iVar3 = uv_close(*(undefined8 *)(pcVar8 + 0x50),close_cb);
    return iVar3;
  }
  pcStack_570 = run_test_spawn_stdio_greater_than_3;
  write_cb_cold_1();
  pcStack_6d8 = (code *)0x16d26e;
  puStack_580 = puVar7;
  aStack_578.stream = (uv_stream_t *)auStack_510;
  pcStack_570 = (code *)unaff_RBP;
  init_process_options("spawn_helper5",exit_cb);
  pcStack_6d8 = (code *)0x16d273;
  uVar5 = uv_default_loop();
  puVar7 = auStack_688;
  pcStack_6d8 = (code *)0x16d287;
  uv_pipe_init(uVar5,puVar7,0);
  uStack_6d0.flags = UV_IGNORE;
  uStack_6c0 = 0;
  uStack_6b0 = 0;
  uStack_6a0 = 0x21;
  options.stdio_count = 4;
  pcStack_6d8 = (code *)0x16d2ba;
  options.stdio = &uStack_6d0;
  puStack_698 = puVar7;
  uVar5 = uv_default_loop();
  pcStack_6d8 = (code *)0x16d2cc;
  iVar3 = uv_spawn(uVar5,&process,&options);
  if (iVar3 == 0) {
    pcStack_6d8 = (code *)0x16d2ec;
    iVar3 = uv_read_start(auStack_688,on_alloc,on_read);
    if (iVar3 != 0) goto LAB_0016d3a8;
    pcStack_6d8 = (code *)0x16d2f9;
    uVar5 = uv_default_loop();
    pcStack_6d8 = (code *)0x16d303;
    iVar3 = uv_run(uVar5,0);
    if (iVar3 != 0) goto LAB_0016d3ad;
    if (exit_cb_called != 1) goto LAB_0016d3b2;
    if (close_cb_called != 2) goto LAB_0016d3b7;
    pcStack_6d8 = (code *)0x16d33a;
    printf("output from stdio[3] is: %s",output);
    if (CONCAT35(output._12_3_,CONCAT41(output._8_4_,output[7])) != 0xa216f69647473 ||
        CONCAT17(output[7],output._0_7_) != 0x7320687472756f66) goto LAB_0016d3bc;
    pcStack_6d8 = (code *)0x16d366;
    puVar7 = (undefined1 *)uv_default_loop();
    pcStack_6d8 = (code *)0x16d37a;
    uv_walk(puVar7,close_walk_cb,0);
    pcStack_6d8 = (code *)0x16d384;
    uv_run(puVar7,0);
    pcStack_6d8 = (code *)0x16d389;
    uVar5 = uv_default_loop();
    pcStack_6d8 = (code *)0x16d391;
    iVar3 = uv_loop_close(uVar5);
    if (iVar3 == 0) {
      return 0;
    }
  }
  else {
    pcStack_6d8 = (code *)0x16d3a8;
    run_test_spawn_stdio_greater_than_3_cold_1();
LAB_0016d3a8:
    pcStack_6d8 = (code *)0x16d3ad;
    run_test_spawn_stdio_greater_than_3_cold_2();
LAB_0016d3ad:
    pcStack_6d8 = (code *)0x16d3b2;
    run_test_spawn_stdio_greater_than_3_cold_3();
LAB_0016d3b2:
    pcStack_6d8 = (code *)0x16d3b7;
    run_test_spawn_stdio_greater_than_3_cold_4();
LAB_0016d3b7:
    pcStack_6d8 = (code *)0x16d3bc;
    run_test_spawn_stdio_greater_than_3_cold_5();
LAB_0016d3bc:
    pcStack_6d8 = (code *)0x16d3c1;
    run_test_spawn_stdio_greater_than_3_cold_6();
  }
  pcStack_6d8 = spawn_tcp_server_helper;
  run_test_spawn_stdio_greater_than_3_cold_7();
  pcStack_7d0 = (code *)0x16d3d2;
  uVar5 = uv_default_loop();
  pcStack_7d0 = (code *)0x16d3dd;
  iVar3 = uv_tcp_init(uVar5,auStack_7c8);
  if (iVar3 == 0) {
    pcStack_7d0 = (code *)0x16d3ee;
    iVar3 = uv_tcp_open(auStack_7c8,3);
    if (iVar3 != 0) goto LAB_0016d417;
    pcStack_7d0 = (code *)0x16d401;
    iVar3 = uv_listen(auStack_7c8,0x1000,0);
    if (iVar3 == 0) {
      return 1;
    }
  }
  else {
    pcStack_7d0 = (code *)0x16d417;
    spawn_tcp_server_helper_cold_1();
LAB_0016d417:
    pcStack_7d0 = (code *)0x16d41c;
    spawn_tcp_server_helper_cold_2();
  }
  pcStack_7d0 = run_test_spawn_tcp_server;
  spawn_tcp_server_helper_cold_3();
  pcStack_7d0 = (code *)puVar7;
  init_process_options("spawn_tcp_server_helper",exit_cb);
  iVar3 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_820);
  if (iVar3 == 0) {
    iStack_824 = -1;
    uVar5 = uv_default_loop();
    iVar3 = uv_tcp_init_ex(uVar5,&tcp_server,2);
    if (iVar3 != 0) goto LAB_0016d582;
    iVar3 = uv_tcp_bind(&tcp_server,auStack_820,0);
    if (iVar3 != 0) goto LAB_0016d587;
    iVar3 = uv_fileno(&tcp_server,&iStack_824);
    if (iVar3 != 0) goto LAB_0016d58c;
    if (iStack_824 < 1) goto LAB_0016d591;
    options.stdio = &uStack_810;
    uStack_810.flags = UV_INHERIT_FD;
    uStack_810.data.fd = 0;
    uStack_800 = 2;
    uStack_7f8 = 1;
    uStack_7f0 = 2;
    uStack_7e8 = 2;
    uStack_7e0 = 2;
    iStack_7d8 = iStack_824;
    options.stdio_count = 4;
    uVar5 = uv_default_loop();
    iVar3 = uv_spawn(uVar5,&process,&options);
    if (iVar3 != 0) goto LAB_0016d596;
    uVar5 = uv_default_loop();
    iVar3 = uv_run(uVar5,0);
    if (iVar3 != 0) goto LAB_0016d59b;
    if (exit_cb_called != 1) goto LAB_0016d5a0;
    if (close_cb_called != 1) goto LAB_0016d5a5;
    uVar5 = uv_default_loop();
    uv_walk(uVar5,close_walk_cb,0);
    uv_run(uVar5,0);
    uVar5 = uv_default_loop();
    iVar3 = uv_loop_close(uVar5);
    if (iVar3 == 0) {
      return 0;
    }
  }
  else {
    run_test_spawn_tcp_server_cold_1();
LAB_0016d582:
    run_test_spawn_tcp_server_cold_2();
LAB_0016d587:
    run_test_spawn_tcp_server_cold_3();
LAB_0016d58c:
    run_test_spawn_tcp_server_cold_4();
LAB_0016d591:
    run_test_spawn_tcp_server_cold_5();
LAB_0016d596:
    run_test_spawn_tcp_server_cold_6();
LAB_0016d59b:
    run_test_spawn_tcp_server_cold_7();
LAB_0016d5a0:
    run_test_spawn_tcp_server_cold_8();
LAB_0016d5a5:
    run_test_spawn_tcp_server_cold_9();
  }
  run_test_spawn_tcp_server_cold_10();
  init_process_options("spawn_helper6",exit_cb);
  options.stdio = (uv_stdio_container_t *)0x0;
  options.stdio_count = 0;
  uVar5 = uv_default_loop();
  iVar3 = uv_spawn(uVar5,&process,&options);
  if (iVar3 == 0) {
    uVar5 = uv_default_loop();
    iVar3 = uv_run(uVar5,0);
    if (iVar3 != 0) goto LAB_0016d65c;
    if (exit_cb_called != 1) goto LAB_0016d661;
    if (close_cb_called != 1) goto LAB_0016d666;
    uVar5 = uv_default_loop();
    uv_walk(uVar5,close_walk_cb,0);
    uv_run(uVar5,0);
    uVar5 = uv_default_loop();
    iVar3 = uv_loop_close(uVar5);
    if (iVar3 == 0) {
      return 0;
    }
  }
  else {
    run_test_spawn_ignored_stdio_cold_1();
LAB_0016d65c:
    run_test_spawn_ignored_stdio_cold_2();
LAB_0016d661:
    run_test_spawn_ignored_stdio_cold_3();
LAB_0016d666:
    run_test_spawn_ignored_stdio_cold_4();
  }
  run_test_spawn_ignored_stdio_cold_5();
  init_process_options("spawn_helper4",kill_cb);
  puVar9 = (uv_timer_t *)uv_default_loop();
  puVar11 = &process;
  iVar3 = uv_spawn(puVar9,&process,&options);
  if (iVar3 == 0) {
    puVar9 = (uv_timer_t *)uv_default_loop();
    puVar12 = &timer;
    iVar3 = uv_timer_init();
    pcVar13 = (code *)puVar12;
    if (iVar3 != 0) goto LAB_0016d743;
    puVar9 = &timer;
    pcVar13 = timer_cb;
    iVar3 = uv_timer_start(&timer,timer_cb,500,0);
    if (iVar3 != 0) goto LAB_0016d748;
    puVar9 = (uv_timer_t *)uv_default_loop();
    pcVar13 = (code *)0x0;
    iVar3 = uv_run();
    if (iVar3 != 0) goto LAB_0016d74d;
    if (exit_cb_called != 1) goto LAB_0016d752;
    if (close_cb_called != 2) goto LAB_0016d757;
    uVar5 = uv_default_loop();
    uv_walk(uVar5,close_walk_cb,0);
    pcVar13 = (code *)0x0;
    uv_run(uVar5);
    puVar9 = (uv_timer_t *)uv_default_loop();
    iVar3 = uv_loop_close();
    if (iVar3 == 0) {
      return 0;
    }
  }
  else {
    run_test_spawn_and_kill_cold_1();
    pcVar13 = (code *)puVar11;
LAB_0016d743:
    run_test_spawn_and_kill_cold_2();
LAB_0016d748:
    run_test_spawn_and_kill_cold_3();
LAB_0016d74d:
    run_test_spawn_and_kill_cold_4();
LAB_0016d752:
    run_test_spawn_and_kill_cold_5();
LAB_0016d757:
    run_test_spawn_and_kill_cold_6();
  }
  run_test_spawn_and_kill_cold_7();
  pcVar10 = "exit_cb";
  puts("exit_cb");
  exit_cb_called = exit_cb_called + 1;
  if ((uv_timer_t *)pcVar13 == (uv_timer_t *)0x0) {
    if (extraout_EDX == 0xf) {
      uv_close(puVar9,close_cb);
      pcVar10 = (char *)(ulong)*(uint *)puVar9->heap_node;
      iVar3 = uv_kill(pcVar10,0);
      if (iVar3 == -3) {
        return iVar3;
      }
      goto LAB_0016d7b6;
    }
  }
  else {
    kill_cb_cold_1();
  }
  kill_cb_cold_2();
LAB_0016d7b6:
  kill_cb_cold_3();
  uv_process_kill(&process,0xf);
  iVar3 = uv_close(pcVar10,close_cb);
  return iVar3;
}

Assistant:

TEST_IMPL(spawn_stdout_and_stderr_to_file_swap) {
#ifndef _WIN32
  int r;
  uv_file stdout_file;
  uv_file stderr_file;
  uv_fs_t fs_req;
  uv_stdio_container_t stdio[3];
  uv_buf_t buf;

  /* Setup. */
  unlink("stdout_file");
  unlink("stderr_file");

  init_process_options("spawn_helper6", exit_cb);

  /* open 'stdout_file' and replace STDOUT_FILENO with it */
  r = uv_fs_open(NULL,
                 &fs_req,
                 "stdout_file",
                 O_CREAT | O_RDWR,
                 S_IRUSR | S_IWUSR,
                 NULL);
  ASSERT(r != -1);
  uv_fs_req_cleanup(&fs_req);
  stdout_file = dup2(r, STDOUT_FILENO);
  ASSERT(stdout_file != -1);

  /* open 'stderr_file' and replace STDERR_FILENO with it */
  r = uv_fs_open(NULL, &fs_req, "stderr_file", O_CREAT | O_RDWR,
      S_IRUSR | S_IWUSR, NULL);
  ASSERT(r != -1);
  uv_fs_req_cleanup(&fs_req);
  stderr_file = dup2(r, STDERR_FILENO);
  ASSERT(stderr_file != -1);

  /* now we're going to swap them: the child process' stdout will be our
   * stderr_file and vice versa */
  options.stdio = stdio;
  options.stdio[0].flags = UV_IGNORE;
  options.stdio[1].flags = UV_INHERIT_FD;
  options.stdio[1].data.fd = stderr_file;
  options.stdio[2].flags = UV_INHERIT_FD;
  options.stdio[2].data.fd = stdout_file;
  options.stdio_count = 3;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 1);

  buf = uv_buf_init(output, sizeof(output));

  /* check the content of stdout_file */
  r = uv_fs_read(NULL, &fs_req, stdout_file, &buf, 1, 0, NULL);
  ASSERT(r >= 15);
  uv_fs_req_cleanup(&fs_req);

  r = uv_fs_close(NULL, &fs_req, stdout_file, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&fs_req);

  printf("output is: %s", output);
  ASSERT(strncmp("hello errworld\n", output, 15) == 0);

  /* check the content of stderr_file */
  r = uv_fs_read(NULL, &fs_req, stderr_file, &buf, 1, 0, NULL);
  ASSERT(r >= 12);
  uv_fs_req_cleanup(&fs_req);

  r = uv_fs_close(NULL, &fs_req, stderr_file, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&fs_req);

  printf("output is: %s", output);
  ASSERT(strncmp("hello world\n", output, 12) == 0);

  /* Cleanup. */
  unlink("stdout_file");
  unlink("stderr_file");

  MAKE_VALGRIND_HAPPY();
  return 0;
#else
  RETURN_SKIP("Unix only test");
#endif
}